

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_opengl2.cpp
# Opt level: O0

bool ImGui_ImplOpenGL2_Init(void)

{
  ImGuiIO *pIVar1;
  void *pvVar2;
  ImGui_ImplOpenGL2_Data *bd;
  ImGuiIO *io;
  undefined8 uVar3;
  
  pIVar1 = ImGui::GetIO();
  uVar3 = 4;
  ImGui::MemAlloc(4);
  pvVar2 = operator_new(uVar3);
  ImGui_ImplOpenGL2_Data::ImGui_ImplOpenGL2_Data((ImGui_ImplOpenGL2_Data *)0x53c942);
  pIVar1->BackendRendererUserData = pvVar2;
  pIVar1->BackendRendererName = "imgui_impl_opengl2";
  return true;
}

Assistant:

bool    ImGui_ImplOpenGL2_Init()
{
    ImGuiIO& io = ImGui::GetIO();
    IM_ASSERT(io.BackendRendererUserData == nullptr && "Already initialized a renderer backend!");

    // Setup backend capabilities flags
    ImGui_ImplOpenGL2_Data* bd = IM_NEW(ImGui_ImplOpenGL2_Data)();
    io.BackendRendererUserData = (void*)bd;
    io.BackendRendererName = "imgui_impl_opengl2";

    return true;
}